

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol_tests.cpp
# Opt level: O3

void torcontrol_tests::CheckParseTorReplyMapping
               (string *input,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *expected)

{
  long lVar1;
  _Base_ptr p_Var2;
  int iVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  _Self __tmp;
  _Self __tmp_1;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 local_130 [16];
  lazy_ostream local_120;
  undefined1 *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  _Base_ptr local_e0;
  undefined **local_d8;
  undefined1 local_d0;
  undefined1 *local_c8;
  _Base_ptr *local_c0;
  _Base_ptr local_b8;
  undefined **local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  _Base_ptr *local_98;
  char *local_90;
  char *local_88;
  assertion_result local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ret;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ParseTorReplyMapping(&ret,input);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/torcontrol_tests.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x3e;
  file.m_begin = (iterator)&local_f0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_100,msg);
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_b8 = (_Base_ptr)(local_130 + 8);
  local_130._8_8_ = ret._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_130._0_8_ = (expected->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_e0 = (_Base_ptr)local_130;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (ret._M_t._M_impl.super__Rb_tree_header._M_node_count == local_130._0_8_);
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/torcontrol_tests.cpp"
  ;
  local_88 = "";
  local_98 = &local_b8;
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_01388f48;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_e0;
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_01388f48;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,&local_120,1,2,REQUIRE,0xf1fdcb,(size_t)&local_90,0x3e,&local_b0,
             "expected.size()",&local_d8);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  p_Var5 = (expected->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(expected->_M_t)._M_impl.super__Rb_tree_header;
  p_Var4 = ret._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var5 != p_Var6 &&
      (_Rb_tree_header *)ret._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &ret._M_t._M_impl.super__Rb_tree_header) {
    do {
      local_140 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/torcontrol_tests.cpp"
      ;
      local_138 = "";
      local_150 = &boost::unit_test::basic_cstring<char_const>::null;
      local_148 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x42;
      file_00.m_begin = (iterator)&local_140;
      msg_00.m_end = pvVar8;
      msg_00.m_begin = pvVar7;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_150,
                 msg_00);
      local_120.m_empty = false;
      local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
      local_110 = boost::unit_test::lazy_ostream::inst;
      local_108 = "";
      p_Var2 = p_Var4[1]._M_parent;
      if (p_Var2 == p_Var5[1]._M_parent) {
        if (p_Var2 == (_Base_ptr)0x0) {
          local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(class_property<bool>)0x1;
        }
        else {
          iVar3 = bcmp(*(void **)(p_Var4 + 1),*(void **)(p_Var5 + 1),(size_t)p_Var2);
          local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(iVar3 == 0);
        }
      }
      else {
        local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(class_property<bool>)0x0;
      }
      local_80.m_message.px = (element_type *)0x0;
      local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_90 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/torcontrol_tests.cpp"
      ;
      local_88 = "";
      local_a8 = 0;
      local_b0 = &PTR__lazy_ostream_01388fc8;
      local_a0 = boost::unit_test::lazy_ostream::inst;
      local_98 = &local_b8;
      local_d0 = 0;
      local_d8 = &PTR__lazy_ostream_01388fc8;
      local_c8 = boost::unit_test::lazy_ostream::inst;
      local_c0 = &local_e0;
      pvVar7 = (iterator)0x1;
      pvVar8 = (iterator)0x2;
      local_e0 = p_Var5 + 1;
      local_b8 = p_Var4 + 1;
      boost::test_tools::tt_detail::report_assertion
                (&local_80,&local_120,1,2,REQUIRE,0xf1fdd6,(size_t)&local_90,0x42,&local_b0,
                 "e_it->first",&local_d8);
      boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
      local_160 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/torcontrol_tests.cpp"
      ;
      local_158 = "";
      local_170 = &boost::unit_test::basic_cstring<char_const>::null;
      local_168 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x43;
      file_01.m_begin = (iterator)&local_160;
      msg_01.m_end = pvVar8;
      msg_01.m_begin = pvVar7;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_170,
                 msg_01);
      local_120.m_empty = false;
      local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
      local_110 = boost::unit_test::lazy_ostream::inst;
      local_108 = "";
      p_Var2 = p_Var4[2]._M_parent;
      if (p_Var2 == p_Var5[2]._M_parent) {
        if (p_Var2 == (_Base_ptr)0x0) {
          local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(class_property<bool>)0x1;
        }
        else {
          iVar3 = bcmp(*(void **)(p_Var4 + 2),*(void **)(p_Var5 + 2),(size_t)p_Var2);
          local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(iVar3 == 0);
        }
      }
      else {
        local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(class_property<bool>)0x0;
      }
      local_80.m_message.px = (element_type *)0x0;
      local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_90 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/torcontrol_tests.cpp"
      ;
      local_88 = "";
      local_a8 = 0;
      local_b0 = &PTR__lazy_ostream_01388fc8;
      local_a0 = boost::unit_test::lazy_ostream::inst;
      local_98 = &local_b8;
      local_d0 = 0;
      local_d8 = &PTR__lazy_ostream_01388fc8;
      local_c8 = boost::unit_test::lazy_ostream::inst;
      local_c0 = &local_e0;
      pvVar7 = (iterator)0x1;
      pvVar8 = (iterator)0x2;
      local_e0 = p_Var5 + 2;
      local_b8 = p_Var4 + 2;
      boost::test_tools::tt_detail::report_assertion
                (&local_80,&local_120,1,2,REQUIRE,0xf1feb7,(size_t)&local_90,0x43,&local_b0,
                 "e_it->second",&local_d8);
      boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
    } while (((_Rb_tree_header *)p_Var4 != &ret._M_t._M_impl.super__Rb_tree_header) &&
            ((_Rb_tree_header *)p_Var5 != p_Var6));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&ret._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void CheckParseTorReplyMapping(std::string input, std::map<std::string,std::string> expected)
{
    auto ret = ParseTorReplyMapping(input);
    BOOST_CHECK_EQUAL(ret.size(), expected.size());
    auto r_it = ret.begin();
    auto e_it = expected.begin();
    while (r_it != ret.end() && e_it != expected.end()) {
        BOOST_CHECK_EQUAL(r_it->first, e_it->first);
        BOOST_CHECK_EQUAL(r_it->second, e_it->second);
        r_it++;
        e_it++;
    }
}